

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_fd.c
# Opt level: O1

int64_t file_skip(archive *a,void *client_data,int64_t request)

{
  int error_number;
  __off_t _Var1;
  int *piVar2;
  __off_t _Var3;
  char *fmt;
  read_file_data *mine;
  
  if (*(char *)((long)client_data + 0x28) == '\0') {
    return 0;
  }
  _Var1 = lseek(*client_data,0,1);
  if (-1 < _Var1) {
    if (*(long *)((long)client_data + 0x20) - _Var1 < request ||
        *(long *)((long)client_data + 0x20) <= _Var1) {
      piVar2 = __errno_location();
      *piVar2 = 0x1d;
    }
    else {
      _Var3 = lseek(*client_data,request,1);
      if (-1 < _Var3) {
        return _Var3 - _Var1;
      }
    }
  }
  *(undefined1 *)((long)client_data + 0x28) = 0;
  piVar2 = __errno_location();
  error_number = *piVar2;
  if (error_number != 0x1d) {
    if (*(int *)((long)client_data + 0x2c) == 1) {
      fmt = "Error seeking in \'%s\'";
    }
    else {
      if (*(int *)((long)client_data + 0x2c) == 0) {
        archive_set_error(a,error_number,"Error seeking in stdin");
        return -1;
      }
      fmt = "Error seeking in \'%ls\'";
    }
    archive_set_error(a,error_number,fmt,(long)client_data + 0x30);
    return -1;
  }
  return 0;
}

Assistant:

static int64_t
file_skip(struct archive *a, void *client_data, int64_t request)
{
	struct read_fd_data *mine = (struct read_fd_data *)client_data;
	off_t skip = (off_t)request;
	int64_t old_offset, new_offset;
	int skip_bits = sizeof(skip) * 8 - 1;  /* off_t is a signed type. */

	if (!mine->use_lseek)
		return (0);

	/* Reduce a request that would overflow the 'skip' variable. */
	if (sizeof(request) > sizeof(skip)) {
		const int64_t max_skip =
		    (((int64_t)1 << (skip_bits - 1)) - 1) * 2 + 1;
		if (request > max_skip)
			skip = (off_t)max_skip;
	}

	/* Reduce 'skip' to the next smallest multiple of block_size */
	skip = (off_t)(((int64_t)skip / mine->block_size) * mine->block_size);
	if (skip == 0)
		return (0);

	if ((old_offset = lseek(mine->fd, 0, SEEK_CUR)) >= 0) {
		if (old_offset >= mine->size ||
		    skip > mine->size - old_offset) {
			/* Do not seek past end of file. */
			errno = ESPIPE;
		} else if ((new_offset = lseek(mine->fd, skip, SEEK_CUR)) >= 0)
			return (new_offset - old_offset);
	}

	/* If seek failed once, it will probably fail again. */
	mine->use_lseek = 0;

	/* Let libarchive recover with read+discard. */
	if (errno == ESPIPE)
		return (0);

	/*
	 * There's been an error other than ESPIPE. This is most
	 * likely caused by a programmer error (too large request)
	 * or a corrupted archive file.
	 */
	archive_set_error(a, errno, "Error seeking");
	return (-1);
}